

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::GetSourceFilePaths
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  __node_base_ptr *lang;
  cmMakefile *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  string_view str;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init_00;
  bool bVar1;
  bool bVar2;
  TargetType TVar3;
  cmGlobalGenerator *pcVar4;
  reference __args;
  char *pcVar5;
  string *psVar6;
  cmBTStringRange cVar7;
  bool local_411;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a0;
  undefined1 local_348 [7];
  bool contextDependentFileSets;
  EvaluatedTargetPropertyEntries fileSetEntries;
  EvaluatedTargetPropertyEntries linkObjectsEntries;
  undefined1 local_300 [6];
  bool contextDependentObjects;
  bool contextDependentInterfaceSources;
  allocator<char> local_2d9;
  string local_2d8;
  undefined1 local_2b8 [8];
  EvaluatedTargetPropertyEntries linkInterfaceSourcesEntries;
  undefined1 local_290 [7];
  bool contextDependentDirectSources;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueSrcs;
  undefined1 local_238 [8];
  EvaluatedTargetPropertyEntries entries;
  string local_210;
  undefined1 local_1f0 [8];
  cmGeneratorExpressionDAGChecker dagChecker;
  undefined1 local_168 [5];
  bool debugSources;
  cmValue local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  iterator local_118;
  size_type local_110;
  undefined1 local_108 [8];
  cmList debugProperties;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *item;
  iterator __end3;
  iterator __begin3;
  cmList *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  iterator local_90;
  size_type local_88;
  undefined1 local_80 [8];
  cmList items;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *entry;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __end2;
  __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  __begin2;
  cmBTStringRange *__range2;
  cmBTStringRange sourceEntries;
  string *config_local;
  cmGeneratorTarget *this_local;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *files;
  
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(__return_storage_ptr__);
  pcVar4 = cmLocalGenerator::GetGlobalGenerator(this->LocalGenerator);
  bVar1 = cmGlobalGenerator::GetConfigureDoneCMP0026(pcVar4);
  if (bVar1) {
    dagChecker._126_1_ = 1;
    local_140 = &local_138;
    this_00 = this->Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_168,"CMAKE_DEBUG_TARGET_PROPERTIES",
               (allocator<char> *)&dagChecker.field_0x7f);
    local_148 = cmMakefile::GetDefinition(this_00,(string *)local_168);
    psVar6 = cmValue::operator_cast_to_string_(&local_148);
    std::__cxx11::string::string((string *)&local_138,(string *)psVar6);
    dagChecker._126_1_ = 0;
    local_118 = &local_138;
    local_110 = 1;
    init._M_len = 1;
    init._M_array = local_118;
    cmList::cmList((cmList *)local_108,init);
    local_400 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_118;
    do {
      local_400 = local_400 + -1;
      std::__cxx11::string::~string((string *)local_400);
    } while (local_400 != &local_138);
    std::__cxx11::string::~string((string *)local_168);
    std::allocator<char>::~allocator((allocator<char> *)&dagChecker.field_0x7f);
    local_411 = false;
    if ((this->DebugSourcesDone & 1U) == 0) {
      local_411 = ::cm::contains<cmList,_char[8],_0>((cmList *)local_108,(char (*) [8])0x1277da4);
    }
    dagChecker.CMP0131 = local_411;
    pcVar4 = cmLocalGenerator::GetGlobalGenerator(this->LocalGenerator);
    bVar1 = cmGlobalGenerator::GetConfigureDoneCMP0026(pcVar4);
    if (bVar1) {
      this->DebugSourcesDone = true;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"SOURCES",(allocator<char> *)&entries.field_0x1f);
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_1f0,this,&local_210,
               (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
    std::__cxx11::string::~string((string *)&local_210);
    std::allocator<char>::~allocator((allocator<char> *)&entries.field_0x1f);
    lang = &uniqueSrcs._M_h._M_single_bucket;
    std::__cxx11::string::string((string *)lang);
    EvaluateTargetPropertyEntries
              ((EvaluatedTargetPropertyEntries *)local_238,this,config,(string *)lang,
               (cmGeneratorExpressionDAGChecker *)local_1f0,&this->SourceEntries);
    std::__cxx11::string::~string((string *)&uniqueSrcs._M_h._M_single_bucket);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_290);
    linkInterfaceSourcesEntries._31_1_ =
         anon_unknown.dwarf_18b9daa::processSources
                   (this,(EvaluatedTargetPropertyEntries *)local_238,__return_storage_ptr__,
                    (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_290,(bool)(dagChecker.CMP0131 & 1));
    EvaluatedTargetPropertyEntries::EvaluatedTargetPropertyEntries
              ((EvaluatedTargetPropertyEntries *)local_2b8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,"INTERFACE_SOURCES",&local_2d9);
    std::__cxx11::string::string((string *)local_300);
    AddInterfaceEntries(this,config,&local_2d8,(string *)local_300,
                        (cmGeneratorExpressionDAGChecker *)local_1f0,
                        (EvaluatedTargetPropertyEntries *)local_2b8,No,Usage);
    std::__cxx11::string::~string((string *)local_300);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::allocator<char>::~allocator(&local_2d9);
    bVar1 = anon_unknown.dwarf_18b9daa::processSources
                      (this,(EvaluatedTargetPropertyEntries *)local_2b8,__return_storage_ptr__,
                       (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_290,(bool)(dagChecker.CMP0131 & 1));
    linkObjectsEntries._30_1_ = 0;
    TVar3 = GetType(this);
    if (TVar3 != OBJECT_LIBRARY) {
      EvaluatedTargetPropertyEntries::EvaluatedTargetPropertyEntries
                ((EvaluatedTargetPropertyEntries *)&fileSetEntries.HadContextSensitiveCondition);
      anon_unknown.dwarf_18b9daa::AddObjectEntries
                (this,config,(cmGeneratorExpressionDAGChecker *)local_1f0,
                 (EvaluatedTargetPropertyEntries *)&fileSetEntries.HadContextSensitiveCondition);
      linkObjectsEntries._30_1_ =
           anon_unknown.dwarf_18b9daa::processSources
                     (this,(EvaluatedTargetPropertyEntries *)
                           &fileSetEntries.HadContextSensitiveCondition,__return_storage_ptr__,
                      (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_290,(bool)(dagChecker.CMP0131 & 1));
      EvaluatedTargetPropertyEntries::~EvaluatedTargetPropertyEntries
                ((EvaluatedTargetPropertyEntries *)&fileSetEntries.HadContextSensitiveCondition);
    }
    EvaluatedTargetPropertyEntries::EvaluatedTargetPropertyEntries
              ((EvaluatedTargetPropertyEntries *)local_348);
    anon_unknown.dwarf_18b9daa::AddFileSetEntries
              (this,config,(cmGeneratorExpressionDAGChecker *)local_1f0,
               (EvaluatedTargetPropertyEntries *)local_348);
    bVar2 = anon_unknown.dwarf_18b9daa::processSources
                      (this,(EvaluatedTargetPropertyEntries *)local_348,__return_storage_ptr__,
                       (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_290,(bool)(dagChecker.CMP0131 & 1));
    if (((((linkInterfaceSourcesEntries._31_1_ & 1) != 0) || (bVar1)) ||
        (linkObjectsEntries._30_1_ != '\0')) || (bVar2)) {
      this->SourcesAreContextDependent = True;
    }
    else {
      this->SourcesAreContextDependent = False;
    }
    debugProperties.Values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    EvaluatedTargetPropertyEntries::~EvaluatedTargetPropertyEntries
              ((EvaluatedTargetPropertyEntries *)local_348);
    EvaluatedTargetPropertyEntries::~EvaluatedTargetPropertyEntries
              ((EvaluatedTargetPropertyEntries *)local_2b8);
    std::
    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unordered_set((unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_290);
    EvaluatedTargetPropertyEntries::~EvaluatedTargetPropertyEntries
              ((EvaluatedTargetPropertyEntries *)local_238);
    cmGeneratorExpressionDAGChecker::~cmGeneratorExpressionDAGChecker
              ((cmGeneratorExpressionDAGChecker *)local_1f0);
    cmList::~cmList((cmList *)local_108);
  }
  else {
    cVar7 = cmTarget::GetSourceEntries_abi_cxx11_(this->Target);
    sourceEntries.Begin = cVar7.End._M_current;
    __range2 = (cmBTStringRange *)cVar7.Begin._M_current;
    __end2 = cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
             ::begin((cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      *)&__range2);
    entry = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
            cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::end((cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *)&__range2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                       *)&entry), bVar1) {
      items.Values.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           &__gnu_cxx::
            __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ::operator*(&__end2)->Value;
      std::__cxx11::string::string
                ((string *)&local_b0,
                 (string *)
                 items.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      local_90 = &local_b0;
      local_88 = 1;
      init_00._M_len = 1;
      init_00._M_array = local_90;
      cmList::cmList((cmList *)local_80,init_00);
      local_3a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_90;
      do {
        local_3a0 = local_3a0 + -1;
        std::__cxx11::string::~string((string *)local_3a0);
      } while (local_3a0 != &local_b0);
      __end3 = cmList::begin_abi_cxx11_((cmList *)local_80);
      item = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             cmList::end_abi_cxx11_((cmList *)local_80);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&item), bVar1) {
        __args = __gnu_cxx::
                 __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end3);
        str = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)__args);
        bVar1 = cmHasLiteralPrefix<18ul>(str,(char (*) [18])"$<TARGET_OBJECTS:");
        if ((!bVar1) || (pcVar5 = (char *)std::__cxx11::string::back(), *pcVar5 != '>')) {
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<std::__cxx11::string_const&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     __return_storage_ptr__,__args);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      cmList::~cmList((cmList *)local_80);
      __gnu_cxx::
      __normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<std::string>> cmGeneratorTarget::GetSourceFilePaths(
  std::string const& config) const
{
  std::vector<BT<std::string>> files;

  if (!this->LocalGenerator->GetGlobalGenerator()->GetConfigureDoneCMP0026()) {
    // At configure-time, this method can be called as part of getting the
    // LOCATION property or to export() a file to be include()d.  However
    // there is no cmGeneratorTarget at configure-time, so search the SOURCES
    // for TARGET_OBJECTS instead for backwards compatibility with OLD
    // behavior of CMP0024 and CMP0026 only.

    cmBTStringRange sourceEntries = this->Target->GetSourceEntries();
    for (auto const& entry : sourceEntries) {
      cmList items{ entry.Value };
      for (auto const& item : items) {
        if (cmHasLiteralPrefix(item, "$<TARGET_OBJECTS:") &&
            item.back() == '>') {
          continue;
        }
        files.emplace_back(item);
      }
    }
    return files;
  }

  cmList debugProperties{ this->Makefile->GetDefinition(
    "CMAKE_DEBUG_TARGET_PROPERTIES") };
  bool debugSources =
    !this->DebugSourcesDone && cm::contains(debugProperties, "SOURCES");

  if (this->LocalGenerator->GetGlobalGenerator()->GetConfigureDoneCMP0026()) {
    this->DebugSourcesDone = true;
  }

  cmGeneratorExpressionDAGChecker dagChecker(this, "SOURCES", nullptr,
                                             nullptr);

  EvaluatedTargetPropertyEntries entries = EvaluateTargetPropertyEntries(
    this, config, std::string(), &dagChecker, this->SourceEntries);

  std::unordered_set<std::string> uniqueSrcs;
  bool contextDependentDirectSources =
    processSources(this, entries, files, uniqueSrcs, debugSources);

  // Collect INTERFACE_SOURCES of all direct link-dependencies.
  EvaluatedTargetPropertyEntries linkInterfaceSourcesEntries;
  AddInterfaceEntries(this, config, "INTERFACE_SOURCES", std::string(),
                      &dagChecker, linkInterfaceSourcesEntries,
                      IncludeRuntimeInterface::No, LinkInterfaceFor::Usage);
  bool contextDependentInterfaceSources = processSources(
    this, linkInterfaceSourcesEntries, files, uniqueSrcs, debugSources);

  // Collect TARGET_OBJECTS of direct object link-dependencies.
  bool contextDependentObjects = false;
  if (this->GetType() != cmStateEnums::OBJECT_LIBRARY) {
    EvaluatedTargetPropertyEntries linkObjectsEntries;
    AddObjectEntries(this, config, &dagChecker, linkObjectsEntries);
    contextDependentObjects = processSources(this, linkObjectsEntries, files,
                                             uniqueSrcs, debugSources);
    // Note that for imported targets or multi-config generators supporting
    // cross-config builds the paths to the object files must be per-config,
    // so contextDependentObjects will be true here even if object libraries
    // are specified without per-config generator expressions.
  }

  // Collect this target's file sets.
  EvaluatedTargetPropertyEntries fileSetEntries;
  AddFileSetEntries(this, config, &dagChecker, fileSetEntries);
  bool contextDependentFileSets =
    processSources(this, fileSetEntries, files, uniqueSrcs, debugSources);

  // Determine if sources are context-dependent or not.
  if (!contextDependentDirectSources && !contextDependentInterfaceSources &&
      !contextDependentObjects && !contextDependentFileSets) {
    this->SourcesAreContextDependent = Tribool::False;
  } else {
    this->SourcesAreContextDependent = Tribool::True;
  }

  return files;
}